

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl_ssse3.c
# Opt level: O0

void cfl_luma_subsampling_420_lbd_ssse3
               (uint8_t *input,int input_stride,uint16_t *pred_buf_q3,int width,int height)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int in_ECX;
  __m128i *in_RDX;
  int iVar11;
  longlong in_RSI;
  __m128i *in_RDI;
  int in_R8D;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  __m128i alVar14;
  __m128i sum_1;
  __m128i bot_1;
  __m128i top_1;
  __m128i sum_3;
  __m128i bot_3;
  __m128i top_3;
  __m128i sum_2;
  __m128i bot_2;
  __m128i top_2;
  __m128i sum;
  __m128i bot;
  __m128i top;
  int luma_stride;
  __m128i *end;
  __m128i *pred_buf_m128i;
  __m128i twos;
  __m128i *local_2b0;
  __m128i *local_278;
  short local_168;
  short sStack_166;
  short sStack_164;
  short sStack_162;
  short sStack_160;
  short sStack_15e;
  short sStack_15c;
  short sStack_15a;
  short local_158;
  short sStack_156;
  short sStack_154;
  short sStack_152;
  short sStack_150;
  short sStack_14e;
  short sStack_14c;
  short sStack_14a;
  short local_148;
  short sStack_146;
  short sStack_144;
  short sStack_142;
  short sStack_140;
  short sStack_13e;
  short sStack_13c;
  short sStack_13a;
  short local_138;
  short sStack_136;
  short sStack_134;
  short sStack_132;
  short sStack_130;
  short sStack_12e;
  short sStack_12c;
  short sStack_12a;
  short local_128;
  short sStack_126;
  short sStack_124;
  short sStack_122;
  short local_118;
  short sStack_116;
  short sStack_114;
  short sStack_112;
  
  iVar11 = (int)in_RSI;
  local_2b0 = in_RDX;
  local_278 = in_RDI;
  do {
    if (in_ECX == 4) {
      _mm_loadh_epi32(local_278);
      auVar10._8_8_ = extraout_XMM0_Qb;
      auVar10._0_8_ = extraout_XMM0_Qa;
      auVar9._8_8_ = 0x202020202020202;
      auVar9._0_8_ = 0x202020202020202;
      pmaddubsw(auVar10,auVar9);
      alVar14 = _mm_loadh_epi32((__m128i *)((long)*local_278 + (long)iVar11));
      auVar8._8_8_ = extraout_XMM0_Qb_00;
      auVar8._0_8_ = extraout_XMM0_Qa_00;
      auVar7._8_8_ = 0x202020202020202;
      auVar7._0_8_ = 0x202020202020202;
      pmaddubsw(auVar8,auVar7);
      alVar14[0] = in_RSI;
      _mm_storeh_epi32(local_2b0,alVar14);
    }
    else if (in_ECX == 8) {
      auVar6._8_8_ = 0;
      auVar6._0_8_ = (*local_278)[0];
      auVar5._8_8_ = 0x202020202020202;
      auVar5._0_8_ = 0x202020202020202;
      auVar12 = pmaddubsw(auVar6,auVar5);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = *(ulong *)((long)*local_278 + (long)iVar11);
      auVar3._8_8_ = 0x202020202020202;
      auVar3._0_8_ = 0x202020202020202;
      auVar13 = pmaddubsw(auVar4,auVar3);
      local_118 = auVar12._0_2_;
      sStack_116 = auVar12._2_2_;
      sStack_114 = auVar12._4_2_;
      sStack_112 = auVar12._6_2_;
      local_128 = auVar13._0_2_;
      sStack_126 = auVar13._2_2_;
      sStack_124 = auVar13._4_2_;
      sStack_122 = auVar13._6_2_;
      (*local_2b0)[0] =
           CONCAT26(sStack_112 + sStack_122,
                    CONCAT24(sStack_114 + sStack_124,
                             CONCAT22(sStack_116 + sStack_126,local_118 + local_128)));
    }
    else {
      auVar13._8_8_ = 0x202020202020202;
      auVar13._0_8_ = 0x202020202020202;
      auVar13 = pmaddubsw((undefined1  [16])*local_278,auVar13);
      auVar12._8_8_ = 0x202020202020202;
      auVar12._0_8_ = 0x202020202020202;
      auVar12 = pmaddubsw(*(undefined1 (*) [16])((long)*local_278 + (long)iVar11),auVar12);
      local_138 = auVar13._0_2_;
      sStack_136 = auVar13._2_2_;
      sStack_134 = auVar13._4_2_;
      sStack_132 = auVar13._6_2_;
      sStack_130 = auVar13._8_2_;
      sStack_12e = auVar13._10_2_;
      sStack_12c = auVar13._12_2_;
      sStack_12a = auVar13._14_2_;
      local_148 = auVar12._0_2_;
      sStack_146 = auVar12._2_2_;
      sStack_144 = auVar12._4_2_;
      sStack_142 = auVar12._6_2_;
      sStack_140 = auVar12._8_2_;
      sStack_13e = auVar12._10_2_;
      sStack_13c = auVar12._12_2_;
      sStack_13a = auVar12._14_2_;
      (*local_2b0)[0] =
           CONCAT26(sStack_132 + sStack_142,
                    CONCAT24(sStack_134 + sStack_144,
                             CONCAT22(sStack_136 + sStack_146,local_138 + local_148)));
      (*local_2b0)[1] =
           CONCAT26(sStack_12a + sStack_13a,
                    CONCAT24(sStack_12c + sStack_13c,
                             CONCAT22(sStack_12e + sStack_13e,sStack_130 + sStack_140)));
      if (in_ECX == 0x20) {
        auVar2._8_8_ = 0x202020202020202;
        auVar2._0_8_ = 0x202020202020202;
        auVar12 = pmaddubsw((undefined1  [16])local_278[1],auVar2);
        auVar1._8_8_ = 0x202020202020202;
        auVar1._0_8_ = 0x202020202020202;
        auVar13 = pmaddubsw(*(undefined1 (*) [16])((long)local_278[1] + (long)iVar11),auVar1);
        local_158 = auVar12._0_2_;
        sStack_156 = auVar12._2_2_;
        sStack_154 = auVar12._4_2_;
        sStack_152 = auVar12._6_2_;
        sStack_150 = auVar12._8_2_;
        sStack_14e = auVar12._10_2_;
        sStack_14c = auVar12._12_2_;
        sStack_14a = auVar12._14_2_;
        local_168 = auVar13._0_2_;
        sStack_166 = auVar13._2_2_;
        sStack_164 = auVar13._4_2_;
        sStack_162 = auVar13._6_2_;
        sStack_160 = auVar13._8_2_;
        sStack_15e = auVar13._10_2_;
        sStack_15c = auVar13._12_2_;
        sStack_15a = auVar13._14_2_;
        local_2b0[1][0] =
             CONCAT26(sStack_152 + sStack_162,
                      CONCAT24(sStack_154 + sStack_164,
                               CONCAT22(sStack_156 + sStack_166,local_158 + local_168)));
        local_2b0[1][1] =
             CONCAT26(sStack_14a + sStack_15a,
                      CONCAT24(sStack_14c + sStack_15c,
                               CONCAT22(sStack_14e + sStack_15e,sStack_150 + sStack_160)));
      }
    }
    local_278 = (__m128i *)((long)*local_278 + (long)(iVar11 << 1));
    local_2b0 = local_2b0 + 4;
  } while (local_2b0 < in_RDX + ((in_R8D >> 1) << 2));
  return;
}

Assistant:

static inline void cfl_luma_subsampling_420_lbd_ssse3(const uint8_t *input,
                                                      int input_stride,
                                                      uint16_t *pred_buf_q3,
                                                      int width, int height) {
  const __m128i twos = _mm_set1_epi8(2);
  __m128i *pred_buf_m128i = (__m128i *)pred_buf_q3;
  const __m128i *end = pred_buf_m128i + (height >> 1) * CFL_BUF_LINE_I128;
  const int luma_stride = input_stride << 1;
  do {
    if (width == 4) {
      __m128i top = _mm_loadh_epi32((__m128i *)input);
      top = _mm_maddubs_epi16(top, twos);
      __m128i bot = _mm_loadh_epi32((__m128i *)(input + input_stride));
      bot = _mm_maddubs_epi16(bot, twos);
      const __m128i sum = _mm_add_epi16(top, bot);
      _mm_storeh_epi32(pred_buf_m128i, sum);
    } else if (width == 8) {
      __m128i top = _mm_loadl_epi64((__m128i *)input);
      top = _mm_maddubs_epi16(top, twos);
      __m128i bot = _mm_loadl_epi64((__m128i *)(input + input_stride));
      bot = _mm_maddubs_epi16(bot, twos);
      const __m128i sum = _mm_add_epi16(top, bot);
      _mm_storel_epi64(pred_buf_m128i, sum);
    } else {
      __m128i top = _mm_loadu_si128((__m128i *)input);
      top = _mm_maddubs_epi16(top, twos);
      __m128i bot = _mm_loadu_si128((__m128i *)(input + input_stride));
      bot = _mm_maddubs_epi16(bot, twos);
      const __m128i sum = _mm_add_epi16(top, bot);
      _mm_storeu_si128(pred_buf_m128i, sum);
      if (width == 32) {
        __m128i top_1 = _mm_loadu_si128(((__m128i *)input) + 1);
        __m128i bot_1 =
            _mm_loadu_si128(((__m128i *)(input + input_stride)) + 1);
        top_1 = _mm_maddubs_epi16(top_1, twos);
        bot_1 = _mm_maddubs_epi16(bot_1, twos);
        __m128i sum_1 = _mm_add_epi16(top_1, bot_1);
        _mm_storeu_si128(pred_buf_m128i + 1, sum_1);
      }
    }
    input += luma_stride;
    pred_buf_m128i += CFL_BUF_LINE_I128;
  } while (pred_buf_m128i < end);
}